

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_tile_info(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  RK_U32 local_dc;
  int local_d4;
  int local_d0;
  RK_U32 local_cc;
  RK_U32 local_c4;
  RK_S32 local_c0;
  RK_S32 local_b8;
  RK_S32 local_b4;
  int local_b0;
  RK_S32 local_ac;
  undefined1 local_a8 [4];
  undefined2 local_a4 [2];
  RK_U32 value_6;
  RK_U32 value_5;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_S32 max_height;
  RK_S32 max_width;
  RK_S32 size_sb;
  RK_S32 start_sb;
  RK_S32 widest_tile_sb;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_S32 tile_height_sb;
  RK_S32 tile_width_sb;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  RK_S32 min_log2_tile_rows;
  RK_S32 min_log2_tiles;
  RK_S32 max_log2_tile_rows;
  RK_S32 max_log2_tile_cols;
  RK_S32 min_log2_tile_cols;
  RK_S32 max_tile_area_sb;
  RK_S32 max_tile_height_sb;
  RK_S32 max_tile_width_sb;
  RK_S32 sb_size;
  RK_S32 sb_shift;
  RK_S32 sb_rows;
  RK_S32 sb_cols;
  RK_S32 mi_rows;
  RK_S32 mi_cols;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _mi_rows = ctx->sequence_header;
  sb_cols = (ctx->frame_width + 7 >> 3) * 2;
  sb_rows = (ctx->frame_height + 7 >> 3) * 2;
  if (_mi_rows->use_128x128_superblock == '\0') {
    local_ac = sb_cols + 0xf >> 4;
  }
  else {
    local_ac = sb_cols + 0x1f >> 5;
  }
  sb_shift = local_ac;
  if (_mi_rows->use_128x128_superblock == '\0') {
    local_b0 = sb_rows + 0xf >> 4;
  }
  else {
    local_b0 = sb_rows + 0x1f >> 5;
  }
  sb_size = local_b0;
  max_tile_width_sb = 4;
  if (_mi_rows->use_128x128_superblock != '\0') {
    max_tile_width_sb = 5;
  }
  max_tile_height_sb = max_tile_width_sb + 2;
  max_tile_area_sb = 0x1000 >> (sbyte)max_tile_height_sb;
  max_log2_tile_cols = 0x900000 >> (sbyte)max_tile_height_sb * '\x02';
  seq = (AV1RawSequenceHeader *)current;
  current_local = (AV1RawFrameHeader *)gb;
  gb_local = &ctx->gb;
  max_log2_tile_rows = mpp_av1_tile_log2(max_tile_area_sb,local_ac);
  if (sb_shift < 0x41) {
    local_b4 = sb_shift;
  }
  else {
    local_b4 = 0x40;
  }
  min_log2_tiles = mpp_av1_tile_log2(1,local_b4);
  if (sb_size < 0x41) {
    local_b8 = sb_size;
  }
  else {
    local_b8 = 0x40;
  }
  min_log2_tile_rows = mpp_av1_tile_log2(1,local_b8);
  RVar2 = max_log2_tile_rows;
  RVar1 = mpp_av1_tile_log2(max_log2_tile_cols,sb_size * sb_shift);
  if (RVar1 < RVar2) {
    local_c0 = max_log2_tile_rows;
  }
  else {
    local_c0 = mpp_av1_tile_log2(max_log2_tile_cols,sb_size * sb_shift);
  }
  i = local_c0;
  tile_width_sb =
       mpp_av1_read_unsigned
                 ((BitReadCtx_t *)current_local,1,"uniform_tile_spacing_flag",
                  (RK_U32 *)&tile_height_sb,0,1);
  if (tile_width_sb < 0) {
    return tile_width_sb;
  }
  *(undefined1 *)((long)seq->decoder_buffer_delay + 0x26) = (undefined1)tile_height_sb;
  if (*(char *)((long)seq->decoder_buffer_delay + 0x26) == '\0') {
    size_sb = 0;
    value = 0;
    for (max_width = 0; max_width < sb_shift && (int)value < 0x40;
        max_width = max_height + max_width) {
      if (max_tile_area_sb < sb_shift - max_width) {
        local_cc = max_tile_area_sb;
      }
      else {
        local_cc = sb_shift - max_width;
      }
      value_3 = local_cc;
      tile_width_sb =
           mpp_av1_read_ns((BitReadCtx_t *)current_local,"width_in_sbs_minus_1[i]",local_cc,&value_5
                          );
      if (tile_width_sb < 0) {
        return tile_width_sb;
      }
      *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x29) = (char)value_5;
      max_height = *(byte *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x29) + 1;
      local_d0 = max_height;
      if (max_height <= size_sb) {
        local_d0 = size_sb;
      }
      size_sb = local_d0;
      value = value + 1;
    }
    RVar2 = mpp_av1_tile_log2(1,value);
    *(char *)((long)seq->decoder_buffer_delay + 0x27) = (char)RVar2;
    *(short *)((long)seq->encoder_buffer_delay + 0x2e) = (short)value;
    if (i < 1) {
      max_log2_tile_cols = sb_size * sb_shift;
    }
    else {
      max_log2_tile_cols = sb_size * sb_shift >> ((char)i + 1U & 0x1f);
    }
    if (max_log2_tile_cols / size_sb < 2) {
      local_d4 = 1;
    }
    else {
      local_d4 = max_log2_tile_cols / size_sb;
    }
    min_log2_tile_cols = local_d4;
    max_width = 0;
    value = 0;
    while( true ) {
      if (sb_size <= max_width || 0x3f < (int)value) break;
      if (min_log2_tile_cols < sb_size - max_width) {
        local_dc = min_log2_tile_cols;
      }
      else {
        local_dc = sb_size - max_width;
      }
      value_4 = local_dc;
      tile_width_sb =
           mpp_av1_read_ns((BitReadCtx_t *)current_local,"height_in_sbs_minus_1[i]",local_dc,
                           &value_6);
      if (tile_width_sb < 0) {
        return tile_width_sb;
      }
      *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x69) = (char)value_6;
      max_height = *(byte *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x69) + 1;
      max_width = max_height + max_width;
      value = value + 1;
    }
    RVar2 = mpp_av1_tile_log2(1,value);
    *(char *)(seq->decoder_buffer_delay + 10) = (char)RVar2;
    *(short *)(seq->encoder_buffer_delay + 0xc) = (short)value;
  }
  else {
    tile_width_sb =
         mpp_av1_read_increment
                   ((BitReadCtx_t *)current_local,max_log2_tile_rows,min_log2_tiles,"tile_cols_log2"
                    ,(RK_U32 *)&widest_tile_sb);
    if (tile_width_sb < 0) {
      return tile_width_sb;
    }
    *(undefined1 *)((long)seq->decoder_buffer_delay + 0x27) = (undefined1)widest_tile_sb;
    value_1 = sb_shift + (1 << (*(byte *)((long)seq->decoder_buffer_delay + 0x27) & 0x1f)) + -1 >>
              (*(byte *)((long)seq->decoder_buffer_delay + 0x27) & 0x1f);
    *(short *)((long)seq->encoder_buffer_delay + 0x2e) =
         (short)((int)(sb_shift + value_1 + -1) / (int)value_1);
    if ((int)(i - (uint)*(byte *)((long)seq->decoder_buffer_delay + 0x27)) < 1) {
      local_c4 = 0;
    }
    else {
      local_c4 = i - (uint)*(byte *)((long)seq->decoder_buffer_delay + 0x27);
    }
    err = local_c4;
    tile_width_sb =
         mpp_av1_read_increment
                   ((BitReadCtx_t *)current_local,local_c4,min_log2_tile_rows,"tile_rows_log2",
                    (RK_U32 *)&start_sb);
    if (tile_width_sb < 0) {
      return tile_width_sb;
    }
    *(undefined1 *)(seq->decoder_buffer_delay + 10) = (undefined1)start_sb;
    value_2 = sb_size + (1 << ((byte)seq->decoder_buffer_delay[10] & 0x1f)) + -1 >>
              ((byte)seq->decoder_buffer_delay[10] & 0x1f);
    *(short *)(seq->encoder_buffer_delay + 0xc) =
         (short)((int)(sb_size + value_2 + -1) / (int)value_2);
    for (value = 0; (int)value < (int)(*(ushort *)((long)seq->encoder_buffer_delay + 0x2e) - 1);
        value = value + 1) {
      *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x29) = (char)value_1 + -1;
    }
    *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x29) =
         ((char)sb_shift -
         ((char)*(undefined2 *)((long)seq->encoder_buffer_delay + 0x2e) + -1) * (char)value_1) + -1;
    for (value = 0; (int)value < (int)((ushort)seq->encoder_buffer_delay[0xc] - 1);
        value = value + 1) {
      *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x69) = (char)value_2 + -1;
    }
    *(char *)((long)seq->decoder_buffer_delay + (long)(int)value + 0x69) =
         ((char)sb_size - ((char)(short)seq->encoder_buffer_delay[0xc] + -1) * (char)value_2) + -1;
  }
  if ((*(char *)((long)seq->decoder_buffer_delay + 0x27) == '\0') &&
     ((char)seq->decoder_buffer_delay[10] == '\0')) {
    *(undefined2 *)((long)seq->encoder_buffer_delay + 0x2a) = 0;
    *(undefined1 *)(seq->encoder_buffer_delay + 0xb) = 3;
  }
  else {
    tile_width_sb =
         mpp_av1_read_unsigned
                   ((BitReadCtx_t *)current_local,
                    (uint)*(byte *)((long)seq->decoder_buffer_delay + 0x27) +
                    (uint)(byte)seq->decoder_buffer_delay[10],"context_update_tile_id",
                    (RK_U32 *)local_a4,0,
                    (int)(1L << (*(char *)((long)seq->decoder_buffer_delay + 0x27) +
                                 (char)seq->decoder_buffer_delay[10] & 0x3fU)) - 1);
    if (tile_width_sb < 0) {
      return tile_width_sb;
    }
    *(undefined2 *)((long)seq->encoder_buffer_delay + 0x2a) = local_a4[0];
    RVar2 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)current_local,2,"tile_size_bytes_minus1",(RK_U32 *)local_a8,0
                       ,3);
    if (RVar2 < 0) {
      return RVar2;
    }
    *(undefined1 *)(seq->encoder_buffer_delay + 0xb) = local_a8[0];
  }
  gb_local[0x50].ret = (uint)*(ushort *)((long)seq->encoder_buffer_delay + 0x2e);
  gb_local[0x50].prevention_type = (uint)(ushort)seq->encoder_buffer_delay[0xc];
  return 0;
}

Assistant:

static RK_S32 mpp_av1_tile_info(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 mi_cols, mi_rows, sb_cols, sb_rows, sb_shift, sb_size;
    RK_S32 max_tile_width_sb, max_tile_height_sb, max_tile_area_sb;
    RK_S32 min_log2_tile_cols, max_log2_tile_cols, max_log2_tile_rows;
    RK_S32 min_log2_tiles, min_log2_tile_rows;
    RK_S32 i, err;

    mi_cols = 2 * ((ctx->frame_width  + 7) >> 3);
    mi_rows = 2 * ((ctx->frame_height + 7) >> 3);

    sb_cols = seq->use_128x128_superblock ? ((mi_cols + 31) >> 5)
              : ((mi_cols + 15) >> 4);
    sb_rows = seq->use_128x128_superblock ? ((mi_rows + 31) >> 5)
              : ((mi_rows + 15) >> 4);

    sb_shift = seq->use_128x128_superblock ? 5 : 4;
    sb_size  = sb_shift + 2;

    max_tile_width_sb = AV1_MAX_TILE_WIDTH >> sb_size;
    max_tile_area_sb  = AV1_MAX_TILE_AREA  >> (2 * sb_size);

    min_log2_tile_cols = mpp_av1_tile_log2(max_tile_width_sb, sb_cols);
    max_log2_tile_cols = mpp_av1_tile_log2(1, MPP_MIN(sb_cols, AV1_MAX_TILE_COLS));
    max_log2_tile_rows = mpp_av1_tile_log2(1, MPP_MIN(sb_rows, AV1_MAX_TILE_ROWS));
    min_log2_tiles = MPP_MAX(min_log2_tile_cols,
                             mpp_av1_tile_log2(max_tile_area_sb, sb_rows * sb_cols));

    flag(uniform_tile_spacing_flag);

    if (current->uniform_tile_spacing_flag) {
        RK_S32 tile_width_sb, tile_height_sb;

        increment(tile_cols_log2, min_log2_tile_cols, max_log2_tile_cols);

        tile_width_sb = (sb_cols + (1 << current->tile_cols_log2) - 1) >>
                        current->tile_cols_log2;
        current->tile_cols = (sb_cols + tile_width_sb - 1) / tile_width_sb;

        min_log2_tile_rows = MPP_MAX(min_log2_tiles - current->tile_cols_log2, 0);

        increment(tile_rows_log2, min_log2_tile_rows, max_log2_tile_rows);

        tile_height_sb = (sb_rows + (1 << current->tile_rows_log2) - 1) >>
                         current->tile_rows_log2;
        current->tile_rows = (sb_rows + tile_height_sb - 1) / tile_height_sb;

        for (i = 0; i < current->tile_cols - 1; i++)
            infer(width_in_sbs_minus_1[i], tile_width_sb - 1);
        infer(width_in_sbs_minus_1[i],
              sb_cols - (current->tile_cols - 1) * tile_width_sb - 1);
        for (i = 0; i < current->tile_rows - 1; i++)
            infer(height_in_sbs_minus_1[i], tile_height_sb - 1);
        infer(height_in_sbs_minus_1[i],
              sb_rows - (current->tile_rows - 1) * tile_height_sb - 1);

    } else {
        RK_S32 widest_tile_sb, start_sb, size_sb, max_width, max_height;

        widest_tile_sb = 0;

        start_sb = 0;
        for (i = 0; start_sb < sb_cols && i < AV1_MAX_TILE_COLS; i++) {
            max_width = MPP_MIN(sb_cols - start_sb, max_tile_width_sb);
            ns(max_width, width_in_sbs_minus_1[i]);
            //ns(max_width, width_in_sbs_minus_1[i]);
            size_sb = current->width_in_sbs_minus_1[i] + 1;
            widest_tile_sb = MPP_MAX(size_sb, widest_tile_sb);
            start_sb += size_sb;
        }
        current->tile_cols_log2 = mpp_av1_tile_log2(1, i);
        current->tile_cols = i;

        if (min_log2_tiles > 0)
            max_tile_area_sb = (sb_rows * sb_cols) >> (min_log2_tiles + 1);
        else
            max_tile_area_sb = sb_rows * sb_cols;
        max_tile_height_sb = MPP_MAX(max_tile_area_sb / widest_tile_sb, 1);

        start_sb = 0;
        for (i = 0; start_sb < sb_rows && i < AV1_MAX_TILE_ROWS; i++) {
            max_height = MPP_MIN(sb_rows - start_sb, max_tile_height_sb);
            ns(max_height, height_in_sbs_minus_1[i]);
            size_sb = current->height_in_sbs_minus_1[i] + 1;
            start_sb += size_sb;
        }
        current->tile_rows_log2 = mpp_av1_tile_log2(1, i);
        current->tile_rows = i;
    }

    if (current->tile_cols_log2 > 0 ||
        current->tile_rows_log2 > 0) {
        fb(current->tile_cols_log2 + current->tile_rows_log2,
           context_update_tile_id);
        fb(2, tile_size_bytes_minus1);
    } else {
        infer(context_update_tile_id, 0);
        current->tile_size_bytes_minus1 = 3;
    }

    ctx->tile_cols = current->tile_cols;
    ctx->tile_rows = current->tile_rows;

    return 0;
}